

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

value * __thiscall
mjs::interpreter::impl::handle_new_expression
          (value *__return_storage_ptr__,impl *this,expression *e)

{
  int iVar1;
  vector<mjs::value,_std::allocator<mjs::value>_> args;
  value o;
  auto_stack_update asu;
  vector<mjs::value,_std::allocator<mjs::value>_> local_238;
  vector<mjs::value,_std::allocator<mjs::value>_> local_218;
  value local_200 [2];
  undefined1 local_198 [376];
  
  local_200[0].type_ = undefined;
  local_218.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (*(e->super_syntax_node)._vptr_syntax_node[3])(e);
  if (iVar1 == 6) {
    eval((value *)local_198,this,(expression *)e[1].super_syntax_node._vptr_syntax_node);
    value::operator=(local_200,(value *)local_198);
    value::destroy((value *)local_198);
    eval_argument_list(&local_238,this,(expression_list *)&e[1].super_syntax_node.extend_);
    local_198._16_8_ =
         local_218.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_198._8_8_ =
         local_218.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_198._0_8_ =
         local_218.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_218.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_238.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_218.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_238.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_218.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_238.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_238.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_238.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_198);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_238);
  }
  else {
    eval((value *)local_198,this,e);
    value::operator=(local_200,(value *)local_198);
    value::destroy((value *)local_198);
  }
  get_value((value *)local_198,this,local_200);
  value::operator=(local_200,(value *)local_198);
  value::destroy((value *)local_198);
  auto_stack_update::auto_stack_update
            ((auto_stack_update *)local_198,this,&(e->super_syntax_node).extend_);
  construct_function(__return_storage_ptr__,local_200,(value *)&value::undefined,&local_218);
  auto_stack_update::~auto_stack_update((auto_stack_update *)local_198);
  std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_218);
  value::destroy(local_200);
  return __return_storage_ptr__;
}

Assistant:

value handle_new_expression(const expression& e) {
        value o;
        std::vector<value> args;
        if (e.type() == expression_type::call) {
            const auto& ce = static_cast<const call_expression&>(e);
            o = eval(ce.member());
            args = eval_argument_list(ce.arguments());
        } else {
            o = eval(e);
        }
        o = get_value(o);
        try {
            auto_stack_update asu{*this, e.extend()};
            return construct_function(o, value::undefined, args);
        } catch (const not_callable_exception&) {
            std::wostringstream woss;
            if (o.type() != value_type::object) {
                woss << to_string(heap_, o).view() << " is not an object";
            } else {
                // TODO: Could get function name here at some point
                woss << o.object_value()->class_name().view() << " is not constructable";
            }            
            throw native_error_exception(native_error_type::type, stack_trace(), woss.str());
        }
    }